

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O0

Iterator __thiscall
axl::sl::
HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
::visit(HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
        *this,char key)

{
  bool bVar1;
  void *pvVar2;
  HashTableEntry<char,_axl::sl::SwitchInfo_*> *pHVar3;
  size_t sVar4;
  char in_SIL;
  HashTableEntry<char,_axl::sl::SwitchInfo_*> *in_RDI;
  size_t in_stack_00000010;
  HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
  *in_stack_00000018;
  size_t loadFactor;
  Entry *entry;
  bool isEqual;
  Iterator it;
  Bucket *bucket;
  size_t hash;
  bool result;
  size_t bucketCount;
  HashTableEntry<char,_axl::sl::SwitchInfo_*> *in_stack_ffffffffffffff68;
  Eq<char,_char> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  char a;
  ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
  *in_stack_ffffffffffffff88;
  IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
  local_48;
  Rwi local_40;
  AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
  *local_38;
  ulong local_30;
  undefined1 local_21;
  size_t local_20;
  char local_11;
  IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
  local_8;
  
  local_11 = in_SIL;
  local_20 = ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
             ::getCount((ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
                         *)&(in_RDI->super_MapEntry<char,_axl::sl::SwitchInfo_*>).m_value);
  if (local_20 == 0) {
    local_20 = 0x20;
    local_21 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
               ::setCount((Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
                           *)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    if (!(bool)local_21) {
      Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
      ::Iterator((Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                  *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      return (Iterator)
             local_8.
             super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
             .m_p;
    }
  }
  local_30 = HashId<char>::operator()((HashId<char> *)(in_RDI + 1),local_11);
  local_40 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
             ::rwi((Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
                    *)in_stack_ffffffffffffff68);
  local_38 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
             ::Rwi::operator[](&local_40,local_30 % local_20);
  local_48.
  super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
  .m_p = (IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
          )ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
           ::getHead((ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
                      *)in_stack_ffffffffffffff68);
  while( true ) {
    pvVar2 = sl::IteratorBase::operator_cast_to_void_((IteratorBase *)&local_48);
    if (pvVar2 == (void *)0x0) {
      pvVar2 = operator_new((size_t)in_stack_ffffffffffffff70,
                            (ZeroInit_t *)in_stack_ffffffffffffff68);
      *(char *)((long)pvVar2 + 0x10) = local_11;
      *(AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
        **)((long)pvVar2 + 0x30) = local_38;
      ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
      ::insertTail(in_stack_ffffffffffffff88,in_RDI);
      ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
      ::insertTail((ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
                    *)in_stack_ffffffffffffff88,in_RDI);
      sVar4 = getCount((HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
                        *)0x137e53);
      if (in_RDI->m_bucket < (Bucket *)((sVar4 * 100) / local_20)) {
        setBucketCount(in_stack_00000018,in_stack_00000010);
      }
      Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
      ::Iterator((Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                  *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      return (Iterator)
             local_8.
             super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
             .m_p;
    }
    in_stack_ffffffffffffff70 =
         (Eq<char,_char> *)
         ((long)&in_RDI[1].super_MapEntry<char,_axl::sl::SwitchInfo_*>.super_ListLink.m_next + 1);
    a = local_11;
    pHVar3 = IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
             ::operator->(&local_48);
    bVar1 = Eq<char,_char>::operator()
                      (in_stack_ffffffffffffff70,a,
                       (pHVar3->super_MapEntry<char,_axl::sl::SwitchInfo_*>).m_key);
    if (bVar1) break;
    IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
    ::operator++((IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
                  *)in_stack_ffffffffffffff68,0);
  }
  Iterator<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::ListLink>>
  ::
  Iterator<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>
            ((Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
              *)in_RDI,
             (Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
              *)CONCAT17(a,in_stack_ffffffffffffff78));
  return (Iterator)
         local_8.
         super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
         .m_p;
}

Assistant:

Iterator
	visit(KeyArg key) {
		size_t bucketCount = m_table.getCount();
		if (!bucketCount) {
			bucketCount = Def_InitialBucketCount;

			bool result = m_table.setCount(bucketCount);
			if (!result)
				return NULL;
		}

		size_t hash = m_hash(key);
		Bucket* bucket = &m_table.rwi()[hash % bucketCount];
		typename Bucket::Iterator it = bucket->getHead();
		for (; it; it++) {
			bool isEqual = m_eq(key, it->m_key);
			if (isEqual)
				return it;
		}

		Entry* entry = new (mem::ZeroInit) Entry;
		entry->m_key = key;
		entry->m_bucket = bucket;
		m_list.insertTail(entry);
		bucket->insertTail(entry);

	#if (AXL_PTR_BITS == 64)
		size_t loadFactor = getCount() * 100 / bucketCount;
	#else
		size_t loadFactor = (size_t)((uint64_t)getCount() * 100 / bucketCount);
	#endif

		if (loadFactor > m_resizeThreshold)
			setBucketCount(bucketCount * 2);

		return entry;
	}